

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmNinjaNormalTargetGenerator::ComputeDeviceLinkCmd_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,cmNinjaNormalTargetGenerator *this)

{
  cmMakefile *pcVar1;
  TargetType TVar2;
  char *pcVar3;
  string cudaLinkCmd;
  string linkCmd;
  allocator<char> local_72;
  allocator<char> local_71;
  string local_70;
  string local_50;
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 local_20 [16];
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_30 = local_20;
  local_28 = 0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_20[0] = 0;
  TVar2 = cmGeneratorTarget::GetType
                    ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                     GeneratorTarget);
  if (TVar2 - STATIC_LIBRARY < 3) {
    pcVar1 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"CMAKE_CUDA_DEVICE_LINK_LIBRARY",&local_71);
    pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_70);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar3,&local_72);
    std::__cxx11::string::~string((string *)&local_70);
    cmSystemTools::ExpandListArgument(&local_50,__return_storage_ptr__,false);
  }
  else {
    if (TVar2 != EXECUTABLE) goto LAB_001d9a20;
    pcVar1 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"CMAKE_CUDA_DEVICE_LINK_EXECUTABLE",&local_71);
    pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_70);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar3,&local_72);
    std::__cxx11::string::~string((string *)&local_70);
    cmSystemTools::ExpandListArgument(&local_50,__return_storage_ptr__,false);
  }
  std::__cxx11::string::~string((string *)&local_50);
LAB_001d9a20:
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> cmNinjaNormalTargetGenerator::ComputeDeviceLinkCmd()
{
  std::vector<std::string> linkCmds;

  // this target requires separable cuda compilation
  // now build the correct command depending on if the target is
  // an executable or a dynamic library.
  std::string linkCmd;
  switch (this->GetGeneratorTarget()->GetType()) {
    case cmStateEnums::STATIC_LIBRARY:
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY: {
      const std::string cudaLinkCmd(
        this->GetMakefile()->GetDefinition("CMAKE_CUDA_DEVICE_LINK_LIBRARY"));
      cmSystemTools::ExpandListArgument(cudaLinkCmd, linkCmds);
    } break;
    case cmStateEnums::EXECUTABLE: {
      const std::string cudaLinkCmd(this->GetMakefile()->GetDefinition(
        "CMAKE_CUDA_DEVICE_LINK_EXECUTABLE"));
      cmSystemTools::ExpandListArgument(cudaLinkCmd, linkCmds);
    } break;
    default:
      break;
  }
  return linkCmds;
}